

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LocalGraphFlower::flow(LocalGraphFlower *this)

{
  bool bVar1;
  size_t __n;
  size_type sVar2;
  reference ppEVar3;
  reference pvVar4;
  reference ppLVar5;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar6;
  reference rVar7;
  LocalSet *local_100;
  LocalGet *local_f8;
  LocalGet *get_2;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  _Bit_type local_d0;
  reference local_c8;
  value_type *gets_1;
  LocalGet *pLStack_b8;
  Index index;
  LocalGet *get_1;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  value_type *gets;
  LocalSet *set;
  LocalGet *get;
  Expression *action;
  pointer *pppLStack_70;
  int i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *actions;
  allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  allGets;
  FlowBlock *block;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
  *__range2;
  size_t numLocals;
  LocalGraphFlower *this_local;
  
  prepareFlowBlocks(this);
  __n = Function::getNumLocals(this->func);
  __end2 = std::
           vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ::begin(&this->flowBlocks);
  block = (FlowBlock *)
          std::
          vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
          ::end(&this->flowBlocks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
                                     *)&block), bVar1) {
    allGets.
    super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
                  ::operator*(&__end2);
    std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>::allocator
              (&local_51);
    std::
    vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
    ::vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
              *)local_50,__n,&local_51);
    std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>::~allocator
              (&local_51);
    pppLStack_70 = &((allGets.
                      super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
    sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       pppLStack_70);
    action._4_4_ = (int)sVar2;
    while (action._4_4_ = action._4_4_ + -1, -1 < action._4_4_) {
      ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           pppLStack_70,(long)action._4_4_);
      get = (LocalGet *)*ppEVar3;
      set = (LocalSet *)Expression::dynCast<wasm::LocalGet>((Expression *)get);
      if (set == (LocalSet *)0x0) {
        gets = (value_type *)Expression::dynCast<wasm::LocalSet>((Expression *)get);
        if ((LocalSet *)gets != (LocalSet *)0x0) {
          pvVar4 = std::
                   vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                   ::operator[]((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                                 *)local_50,(ulong)((LocalSet *)gets)->index);
          __end6 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin(pvVar4);
          get_1 = (LocalGet *)
                  std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end(pvVar4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                             *)&get_1), bVar1) {
            ppLVar5 = __gnu_cxx::
                      __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                      ::operator*(&__end6);
            pLStack_b8 = *ppLVar5;
            pSVar6 = &std::
                      unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                      ::operator[](this->getSetsMap,&stack0xffffffffffffff48)->
                      super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ;
            SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::insert(pSVar6,(LocalSet **)&gets);
            __gnu_cxx::
            __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
            ::operator++(&__end6);
          }
          std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::clear(pvVar4);
        }
      }
      else {
        pvVar4 = std::
                 vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                 ::operator[]((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                               *)local_50,(ulong)set->index);
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
                  (pvVar4,(value_type *)&set);
      }
    }
    for (gets_1._4_4_ = 0; gets_1._4_4_ < __n; gets_1._4_4_ = gets_1._4_4_ + 1) {
      local_c8 = std::
                 vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                 ::operator[]((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                               *)local_50,(ulong)gets_1._4_4_);
      bVar1 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::empty(local_c8);
      if (!bVar1) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->hasSet,(ulong)gets_1._4_4_);
        local_d0 = rVar7._M_mask;
        __range5 = (value_type *)rVar7._M_p;
        bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range5);
        pvVar4 = local_c8;
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          flowBackFromStartOfBlock
                    (this,(FlowBlock *)
                          allGets.
                          super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,gets_1._4_4_,local_c8);
        }
        else {
          __end5 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin(local_c8)
          ;
          get_2 = (LocalGet *)
                  std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end(pvVar4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                             *)&get_2), bVar1) {
            ppLVar5 = __gnu_cxx::
                      __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                      ::operator*(&__end5);
            local_f8 = *ppLVar5;
            pSVar6 = &std::
                      unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                      ::operator[](this->getSetsMap,&local_f8)->
                      super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ;
            local_100 = (LocalSet *)0x0;
            SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::insert(pSVar6,&local_100);
            __gnu_cxx::
            __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
            ::operator++(&__end5);
          }
        }
      }
    }
    std::
    vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
    ::~vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
               *)local_50);
    __gnu_cxx::
    __normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void flow() {
    prepareFlowBlocks();

    auto numLocals = func->getNumLocals();

    for (auto& block : flowBlocks) {
#ifdef LOCAL_GRAPH_DEBUG
      std::cout << "basic block " << &block << " :\n";
      for (auto& action : block.actions) {
        std::cout << "  action: " << *action << '\n';
      }
      for (auto& val : block.lastSets) {
        std::cout << "  last set " << val.second << '\n';
      }
#endif

      // Track all gets in this block, by index.
      std::vector<std::vector<LocalGet*>> allGets(numLocals);

      // go through the block, finding each get and adding it to its index,
      // and seeing how sets affect that
      auto& actions = block.actions;

      // move towards the front, handling things as we go
      for (int i = int(actions.size()) - 1; i >= 0; i--) {
        auto* action = actions[i];
        if (auto* get = action->dynCast<LocalGet>()) {
          allGets[get->index].push_back(get);
        } else if (auto* set = action->dynCast<LocalSet>()) {
          // This set is the only set for all those gets.
          auto& gets = allGets[set->index];
          for (auto* get : gets) {
            getSetsMap[get].insert(set);
          }
          gets.clear();
        }
      }
      // If anything is left, we must flow it back through other blocks. we
      // can do that for all gets as a whole, they will get the same results.
      for (Index index = 0; index < numLocals; index++) {
        auto& gets = allGets[index];
        if (gets.empty()) {
          continue;
        }
        if (!hasSet[index]) {
          // This local index has no sets, so we know all gets will end up
          // reaching the entry block. Do that here as an optimization to avoid
          // flowing through the (potentially very many) blocks in the function.
          //
          // Note that we may be in unreachable code, and if so, we might add
          // the entry values when they are not actually relevant. That is, we
          // are not precise in the case of unreachable code. This can be
          // confusing when debugging, but it does not have any downside for
          // optimization (since unreachable code should be removed anyhow).
          for (auto* get : gets) {
            getSetsMap[get].insert(nullptr);
          }
          continue;
        }

        flowBackFromStartOfBlock(&block, index, gets);
      }
    }
  }